

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

int __thiscall glcts::SamplerLayoutBindingCase::maxArraySize(SamplerLayoutBindingCase *this)

{
  int iVar1;
  Functions *pFVar2;
  GLint local_14;
  SamplerLayoutBindingCase *pSStack_10;
  int units;
  SamplerLayoutBindingCase *this_local;
  
  local_14 = 0;
  pSStack_10 = this;
  iVar1 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x14])();
  if (iVar1 == 0) {
    pFVar2 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
    (*pFVar2->getIntegerv)(0x8b4c,&local_14);
  }
  else if (iVar1 == 1) {
    pFVar2 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
    (*pFVar2->getIntegerv)(0x8872,&local_14);
  }
  else if (iVar1 == 2) {
    pFVar2 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
    (*pFVar2->getIntegerv)(0x91bc,&local_14);
  }
  return local_14;
}

Assistant:

virtual int maxArraySize()
	{
		int units = 0;

		switch (getStage())
		{
		case VertexShader:
			gl().getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &units);
			break;
		case FragmentShader:
			gl().getIntegerv(GL_MAX_TEXTURE_IMAGE_UNITS, &units);
			break;
		case ComputeShader:
			gl().getIntegerv(GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS, &units);
			break;
		default:
			DE_ASSERT(0);
			break;
		}

		return units;
	}